

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstCountPass.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1d26::InstCountPass::runOnFunction(InstCountPass *this,Function *F)

{
  StringRef Str;
  bool bVar1;
  raw_ostream *prVar2;
  reference this_00;
  Instruction *i;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  Function *__range1;
  int instcount;
  Function *F_local;
  InstCountPass *this_local;
  
  prVar2 = (raw_ostream *)llvm::errs();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"Function ");
  Str = (StringRef)llvm::Value::getName();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str);
  llvm::raw_ostream::operator<<(prVar2," contains ");
  __range1._4_4_ = 0;
  __end1 = llvm::Function::begin(F);
  bb = (BasicBlock *)llvm::Function::end(F);
  while( true ) {
    bVar1 = llvm::operator!=(&__end1,(ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                      *)&bb);
    if (!bVar1) break;
    this_00 = llvm::
              ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
              ::operator*(&__end1);
    __end2 = llvm::BasicBlock::begin(this_00);
    i = (Instruction *)llvm::BasicBlock::end(this_00);
    while( true ) {
      bVar1 = llvm::operator!=(&__end2,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                        *)&i);
      if (!bVar1) break;
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator*(&__end2);
      __range1._4_4_ = __range1._4_4_ + 1;
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++(&__end2);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
    ::operator++(&__end1);
  }
  prVar2 = (raw_ostream *)llvm::errs();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,__range1._4_4_);
  llvm::raw_ostream::operator<<(prVar2," LLVM instructions\n");
  return false;
}

Assistant:

bool InstCountPass::runOnFunction(Function &F) {
    errs() << "Function " << F.getName() << " contains ";
    int instcount = 0;
    for (auto& bb : F) {
      for (auto& i : bb) {
        instcount++;
      }
    }
    errs() << instcount << " LLVM instructions\n";
    return false; 
}